

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O2

void divsufsortxx::helper::
     fixdown<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (iterator Td,iterator SA,long i,long size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  undefined4 extraout_var_03;
  long lVar5;
  pos_type pVar6;
  long lVar7;
  BitmapArray<long> *pBVar8;
  long lVar9;
  pos_type pVar10;
  BitmapArray<long> *pBVar11;
  value_reference local_50;
  value_reference local_40;
  undefined4 extraout_var_02;
  undefined4 extraout_var_04;
  
  pVar10 = Td.pos_;
  pBVar11 = Td.array_;
  pVar6 = SA.pos_;
  pBVar8 = SA.array_;
  iVar1 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,i + pVar6);
  iVar2 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])(pBVar11,CONCAT44(extraout_var,iVar1) + pVar10);
  while (lVar9 = i * 2 + 1, lVar9 < size) {
    iVar3 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,lVar9 + pVar6);
    iVar3 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar11,CONCAT44(extraout_var_01,iVar3) + pVar10);
    lVar4 = CONCAT44(extraout_var_02,iVar3);
    iVar3 = (*(pBVar8->super_Bitmap)._vptr_Bitmap[5])(pBVar8,i * 2 + pVar6 + 2);
    iVar3 = (*(pBVar11->super_Bitmap)._vptr_Bitmap[5])
                      (pBVar11,CONCAT44(extraout_var_03,iVar3) + pVar10);
    lVar5 = CONCAT44(extraout_var_04,iVar3);
    lVar7 = lVar4;
    if (lVar4 <= lVar5) {
      lVar7 = lVar5;
    }
    if (lVar7 <= CONCAT44(extraout_var_00,iVar2)) break;
    if (lVar4 < lVar5) {
      lVar9 = i * 2 + 2;
    }
    local_40.pos_ = lVar9 + pVar6;
    local_50.pos_ = i + pVar6;
    local_50.array_ = pBVar8;
    local_40.array_ = pBVar8;
    bitmap::BitmapArray<long>::value_reference::operator=(&local_50,&local_40);
    i = lVar9;
  }
  (*(pBVar8->super_Bitmap)._vptr_Bitmap[4])(pBVar8,i + pVar6,CONCAT44(extraout_var,iVar1));
  return;
}

Assistant:

void fixdown(const StringIterator_type Td, SAIterator_type SA, pos_type i,
             pos_type size) {
  typedef typename std::iterator_traits<StringIterator_type>::value_type value_type;
  pos_type j, k, t;
  value_type c, d, e;

  for (t = SA[i], c = Td[t]; (j = 2 * i + 1) < size; SA[i] = SA[k], i = k) {
    d = Td[SA[k = j++]];
    if (d < (e = Td[SA[j]])) {
      k = j;
      d = e;
    }
    if (d <= c) {
      break;
    }
  }
  SA[i] = t;
}